

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * QuestSerialize_abi_cxx11_
                   (string *__return_storage_ptr__,
                   map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                   *list,set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                         *list_inactive)

{
  bool bVar1;
  short sVar2;
  reference ppVar3;
  element_type *peVar4;
  Quest *this;
  reference pCVar5;
  int subject;
  int subject_00;
  string local_160;
  _Self local_140;
  _Self local_138;
  undefined1 local_130 [8];
  Character_QuestState state;
  iterator __end1_1;
  iterator __begin1_1;
  set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
  *__range1_1;
  string local_b0;
  string local_80;
  undefined4 local_5c;
  undefined1 local_58 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> quest;
  const_iterator __end1;
  const_iterator __begin1;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range1;
  set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
  *list_inactive_local;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *list_local;
  string *serialized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
           ::begin(list);
  quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
       ::end(list);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&quest.second.
                                                                                                      
                                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>
             ::operator*(&__end1);
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_58,ppVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&quest);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&quest);
      this = Quest_Context::GetQuest(peVar4);
      sVar2 = Quest::ID(this);
      util::to_string_abi_cxx11_(&local_80,(util *)(ulong)(uint)(int)sVar2,subject);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      peVar4 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&quest);
      EOPlus::Context::StateName_abi_cxx11_(&local_b0,&peVar4->super_Context);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      peVar4 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&quest);
      Quest_Context::SerializeProgress_abi_cxx11_((string *)&__range1_1,peVar4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_5c = 0;
    }
    else {
      local_5c = 3;
    }
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_58);
    std::_Rb_tree_const_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::
             set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
             ::begin(list_inactive);
  state.quest_progress.field_2._8_8_ =
       std::
       set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
       ::end(list_inactive);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)((long)&state.quest_progress.field_2 + 8)),
        bVar1) {
    pCVar5 = std::_Rb_tree_const_iterator<Character_QuestState>::operator*(&__end1_1);
    Character_QuestState::Character_QuestState((Character_QuestState *)local_130,pCVar5);
    local_138._M_node =
         (_Base_ptr)
         std::
         map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
         ::find(list,(key_type *)local_130);
    local_140._M_node =
         (_Base_ptr)
         std::
         map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
         ::end(list);
    bVar1 = std::operator!=(&local_138,&local_140);
    if (bVar1) {
      local_5c = 5;
    }
    else {
      util::to_string_abi_cxx11_
                (&local_160,(util *)(ulong)(uint)(int)(short)local_130._0_2_,subject_00);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_5c = 0;
    }
    Character_QuestState::~Character_QuestState((Character_QuestState *)local_130);
    std::_Rb_tree_const_iterator<Character_QuestState>::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QuestSerialize(const std::map<short, std::shared_ptr<Quest_Context>>& list, const std::set<Character_QuestState>& list_inactive)
{
	std::string serialized;

	UTIL_FOREACH(list, quest)
	{
		if (!quest.second)
			continue;

		serialized.append(util::to_string(quest.second->GetQuest()->ID()));
		serialized.append(",");
		serialized.append(quest.second->StateName());
		serialized.append(",");
		serialized.append(quest.second->SerializeProgress());
		serialized.append(";");
	}

	UTIL_FOREACH(list_inactive, state)
	{
		if (list.find(state.quest_id) != list.end())
		{
#ifdef DEBUG
			Console::Dbg("Discarding inactive quest save as the quest was restarted: %i", state.quest_id);
#endif // DEBUG
			continue;
		}

		serialized.append(util::to_string(state.quest_id));
		serialized.append(",");
		serialized.append(state.quest_state);
		serialized.append(",");
		serialized.append(state.quest_progress);
		serialized.append(";");
	}

	return serialized;
}